

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_164e3c3::cmLoadedCommand::InitialPass
          (cmLoadedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  char **argv;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *name;
  ulong uVar4;
  SignalHandlerGuard *this_01;
  pointer pbVar5;
  uint argc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  cmMakefile *pcVar6;
  long *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_38;
  
  peVar1 = (this->Impl).
           super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1->super_cmLoadedCommandInfo).InitialPass == (CM_INITIAL_PASS_FUNCTION)0x0) {
    return true;
  }
  pcVar3 = (peVar1->super_cmLoadedCommandInfo).Error;
  name = args;
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5;
  argc = (uint)(uVar4 >> 5);
  if (argc == 0) {
    argv = (char **)0x0;
  }
  else {
    argv = (char **)malloc((long)(uVar4 * 0x8000000) >> 0x1d);
    if (0 < (int)argc) {
      uVar4 = 0;
      do {
        pcVar3 = strdup((pbVar5->_M_dataplus)._M_p);
        argv[uVar4] = pcVar3;
        uVar4 = uVar4 + 1;
        pbVar5 = pbVar5 + 1;
      } while ((argc & 0x7fffffff) != uVar4);
    }
  }
  pcVar6 = (this->super_cmCommand).Makefile;
  this_01 = (SignalHandlerGuard *)
            (this->Impl).
            super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  SignalHandlerGuard::SignalHandlerGuard(*(SignalHandlerGuard **)(this_01 + 0x48),(char *)name);
  iVar2 = (**(CM_INITIAL_PASS_FUNCTION *)(this_01 + 0x20))(this_01,pcVar6,argc,argv);
  SignalHandlerGuard::~SignalHandlerGuard(this_01);
  cmFreeArguments(argc,argv);
  peVar1 = (this->Impl).
           super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (iVar2 == 0) {
    pcVar3 = (peVar1->super_cmLoadedCommandInfo).Error;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_78._M_pod_data,pcVar3,(allocator<char> *)&local_98);
      cmCommand::SetError(&this->super_cmCommand,(string *)&local_78);
      if ((code **)local_78._M_unused._0_8_ != &local_68) {
        operator_delete(local_78._M_unused._M_object,(ulong)(local_68 + 1));
      }
    }
    return false;
  }
  if ((peVar1->super_cmLoadedCommandInfo).FinalPass == (CM_FINAL_PASS_FUNCTION)0x0) {
    return true;
  }
  this_00 = (this->Impl).
            super___shared_ptr<(anonymous_namespace)::LoadedCommandImpl,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pcVar6 = (this->super_cmCommand).Makefile;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      pcVar6 = (this->super_cmCommand).Makefile;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        goto LAB_0040b476;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
      pcVar6 = (this->super_cmCommand).Makefile;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
LAB_0040b476:
  local_90 = 0;
  local_98 = (long *)operator_new(0x10);
  *local_98 = (long)peVar1;
  local_98[1] = (long)this_00;
  local_60 = std::
             _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLoadCommandCommand.cxx:187:9)>
             ::_M_invoke;
  local_78._8_8_ = local_90;
  local_68 = std::
             _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLoadCommandCommand.cxx:187:9)>
             ::_M_manager;
  local_88 = (code *)0x0;
  uStack_80 = 0;
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_38._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
       (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
       (_Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)0x0;
  local_78._M_unused._M_object = local_98;
  cmMakefile::AddGeneratorAction(pcVar6,(GeneratorAction *)&local_78);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
            ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_38);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return true;
}

Assistant:

bool cmLoadedCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (!this->Impl->InitialPass) {
    return true;
  }

  // clear the error string
  if (this->Impl->Error) {
    free(this->Impl->Error);
  }

  // create argc and argv and then invoke the command
  int argc = static_cast<int>(args.size());
  char** argv = nullptr;
  if (argc) {
    argv = static_cast<char**>(malloc(argc * sizeof(char*)));
  }
  int i;
  for (i = 0; i < argc; ++i) {
    argv[i] = strdup(args[i].c_str());
  }
  int result = this->Impl->DoInitialPass(this->Makefile, argc, argv);
  cmFreeArguments(argc, argv);

  if (result) {
    if (this->Impl->FinalPass) {
      auto impl = this->Impl;
      this->Makefile->AddGeneratorAction(
        [impl](cmLocalGenerator& lg, const cmListFileBacktrace&) {
          impl->DoFinalPass(lg.GetMakefile());
        });
    }
    return true;
  }

  /* Initial Pass must have failed so set the error string */
  if (this->Impl->Error) {
    this->SetError(this->Impl->Error);
  }
  return false;
}